

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<int,3ul>
          (AsciiParser *this,char sep,
          vector<nonstd::optional_lite::optional<std::array<int,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<int,_3UL>_>_>_>
          *result)

{
  bool bVar1;
  StreamReader *pSVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char c;
  array<int,_3UL> value;
  char local_5d;
  array<int,_3UL> local_5c;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if (*(long *)(result + 8) != *(long *)result) {
    *(long *)(result + 8) = *(long *)result;
  }
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (!bVar1) {
    return false;
  }
  bVar1 = MaybeNone(this);
  if (bVar1) {
    local_50._0_4_ = local_50._0_4_ & 0xffffff00;
    local_50._4_4_ = (anon_struct_4_0_00000001_for___align)0x0;
    local_50._8_4_ = 0;
    local_50._12_4_ = 0;
  }
  else {
    bVar1 = ParseBasicTypeTuple<int,3ul>(this,&local_5c);
    if (!bVar1) {
      pcVar5 = "Not starting with the tuple value of requested type.\n";
      pcVar4 = "";
      goto LAB_003ae421;
    }
    local_50[0] = 1;
    local_50._4_4_ = local_5c._M_elems[0];
    local_50._8_4_ = local_5c._M_elems[1];
    local_50._12_4_ = local_5c._M_elems[2];
  }
  ::std::
  vector<nonstd::optional_lite::optional<std::array<int,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,3ul>>>>
  ::emplace_back<nonstd::optional_lite::optional<std::array<int,3ul>>>
            ((vector<nonstd::optional_lite::optional<std::array<int,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,3ul>>>>
              *)result,(optional<std::array<int,_3UL>_> *)local_50);
  pSVar2 = this->_sr;
  uVar3 = pSVar2->idx_;
  if (uVar3 < pSVar2->length_) {
    while (pSVar2->binary_[uVar3] != '\0') {
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = Char1(this,&local_5d);
      if (!bVar1) {
        return false;
      }
      if (local_5d != sep) {
        pSVar2 = this->_sr;
        if ((0 < (long)pSVar2->idx_) && (uVar3 = pSVar2->idx_ - 1, uVar3 <= pSVar2->length_)) {
          pSVar2->idx_ = uVar3;
        }
        break;
      }
      bVar1 = SkipWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = MaybeNone(this);
      if (bVar1) {
        local_50._0_4_ = local_50._0_4_ & 0xffffff00;
        local_50._12_4_ = 0;
        local_50._4_4_ = (anon_struct_4_0_00000001_for___align)0x0;
        local_50._8_4_ = 0;
      }
      else {
        bVar1 = ParseBasicTypeTuple<int,3ul>(this,&local_5c);
        if (!bVar1) break;
        local_50[0] = 1;
        local_50._12_4_ = local_5c._M_elems[2];
        local_50._4_4_ = local_5c._M_elems[0];
        local_50._8_4_ = local_5c._M_elems[1];
      }
      ::std::
      vector<nonstd::optional_lite::optional<std::array<int,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,3ul>>>>
      ::emplace_back<nonstd::optional_lite::optional<std::array<int,3ul>>>
                ((vector<nonstd::optional_lite::optional<std::array<int,3ul>>,std::allocator<nonstd::optional_lite::optional<std::array<int,3ul>>>>
                  *)result,(optional<std::array<int,_3UL>_> *)local_50);
      pSVar2 = this->_sr;
      uVar3 = pSVar2->idx_;
      if (pSVar2->length_ <= uVar3) break;
    }
  }
  if (*(long *)result != *(long *)(result + 8)) {
    return true;
  }
  pcVar5 = "Empty array.\n";
  pcVar4 = "";
LAB_003ae421:
  local_50._0_8_ = &local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar5,pcVar4);
  PushError(this,(string *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._0_8_ != &local_40) {
    operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1TupleType(
    const char sep, std::vector<nonstd::optional<std::array<T, N>>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (MaybeNone()) {
    result->push_back(nonstd::nullopt);
  } else {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    if (MaybeNone()) {
      result->push_back(nonstd::nullopt);
    } else {
      std::array<T, N> value;
      if (!ParseBasicTypeTuple<T, N>(&value)) {
        break;
      }
      result->push_back(value);
    }
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}